

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

bool tcu::astc::anon_unknown_0::isValidBlockParams
               (NormalBlockParams *params,int blockWidth,int blockHeight)

{
  bool bVar1;
  ISEMode IVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar1 = params->isDualPlane;
  iVar5 = params->weightGridHeight * params->weightGridWidth << (bVar1 & 0x1fU);
  IVar2 = (params->weightISEParams).mode;
  if (IVar2 == ISEMODE_PLAIN_BIT) {
    iVar7 = (params->weightISEParams).numBits * iVar5;
  }
  else {
    if (IVar2 == ISEMODE_QUINT) {
      iVar7 = (iVar5 * 7) / 3;
      bVar11 = iVar5 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar7 = -1;
      if (IVar2 != ISEMODE_TRIT) goto LAB_001679a4;
      iVar7 = (iVar5 * 8) / 5;
      bVar11 = iVar5 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar7 = (params->weightISEParams).numBits * iVar5 + ((iVar7 + 1) - (uint)bVar11);
  }
LAB_001679a4:
  uVar3 = params->numPartitions;
  if (params->isMultiPartSingleCemMode == false) {
    if ((int)uVar3 < 1) {
      iVar6 = 0;
    }
    else {
      uVar10 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (params->colorEndpointModes[uVar10] >> 2) * 2 + 2;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
    }
  }
  else {
    iVar6 = ((params->colorEndpointModes[0] >> 2) * 2 + 2) * uVar3;
  }
  if (IVar2 == ISEMODE_PLAIN_BIT) {
    iVar9 = (params->weightISEParams).numBits * iVar5;
  }
  else {
    if (IVar2 == ISEMODE_QUINT) {
      iVar9 = (iVar5 * 7) / 3;
      bVar11 = iVar5 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
    }
    else {
      iVar9 = -1;
      if (IVar2 != ISEMODE_TRIT) goto LAB_00167a8e;
      iVar9 = (iVar5 * 8) / 5;
      bVar11 = iVar5 * 0x66666668 + 0x19999999U < 0x33333333;
    }
    iVar9 = (params->weightISEParams).numBits * iVar5 + ((iVar9 + 1) - (uint)bVar11);
  }
LAB_00167a8e:
  iVar8 = -0x1d;
  if (params->isMultiPartSingleCemMode == false) {
    iVar8 = uVar3 * -3 + -0x19;
  }
  iVar4 = -0x11;
  if ((ulong)uVar3 != 1) {
    iVar4 = iVar8;
  }
  if ((iVar5 < 0x41) &&
     ((params->weightGridHeight <= blockHeight && params->weightGridWidth <= blockWidth) &&
      0xffffffb6 < iVar7 - 0x61U)) {
    if (uVar3 == 4) {
      if (iVar6 < 0x13 && bVar1 == false) {
LAB_00167afb:
        return (int)(((iVar6 * 0xd) / 5 + 1) - (uint)(iVar6 * 0x66666669 + 0x19999999U < 0x33333333)
                    ) <= (int)(((iVar4 + (uint)(bVar1 ^ 1) * 2) - iVar9) + 0x7e);
      }
    }
    else if (iVar6 < 0x13) goto LAB_00167afb;
  }
  return false;
}

Assistant:

static inline int computeNumWeights (const NormalBlockParams& params)
{
	return params.weightGridWidth * params.weightGridHeight * (params.isDualPlane ? 2 : 1);
}